

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# xr_level_wallmarks.cxx
# Opt level: O1

void __thiscall write_wm_data::operator()(write_wm_data *this,wm_data *wm,xr_writer *w)

{
  pointer pwVar1;
  pointer pwVar2;
  float local_1c;
  
  local_1c = (wm->bounds).p.field_0.field_0.x;
  (*w->_vptr_xr_writer[2])(w,&local_1c,4);
  local_1c = (wm->bounds).p.field_0.field_0.y;
  (*w->_vptr_xr_writer[2])(w,&local_1c,4);
  local_1c = (wm->bounds).p.field_0.field_0.z;
  (*w->_vptr_xr_writer[2])(w,&local_1c,4);
  local_1c = (wm->bounds).r;
  (*w->_vptr_xr_writer[2])(w,&local_1c,4);
  local_1c = (float)((int)((ulong)((long)(wm->vertices).
                                         super__Vector_base<xray_re::wm_vertex,_std::allocator<xray_re::wm_vertex>_>
                                         ._M_impl.super__Vector_impl_data._M_finish -
                                  (long)(wm->vertices).
                                        super__Vector_base<xray_re::wm_vertex,_std::allocator<xray_re::wm_vertex>_>
                                        ._M_impl.super__Vector_impl_data._M_start) >> 3) *
                    -0x55555555);
  (*w->_vptr_xr_writer[2])(w,&local_1c,4);
  pwVar1 = (wm->vertices).
           super__Vector_base<xray_re::wm_vertex,_std::allocator<xray_re::wm_vertex>_>._M_impl.
           super__Vector_impl_data._M_start;
  pwVar2 = (wm->vertices).
           super__Vector_base<xray_re::wm_vertex,_std::allocator<xray_re::wm_vertex>_>._M_impl.
           super__Vector_impl_data._M_finish;
  if (pwVar1 != pwVar2) {
    (*w->_vptr_xr_writer[2])(w,pwVar1,(long)pwVar2 - (long)pwVar1);
  }
  return;
}

Assistant:

void operator()(const wm_data& wm, xr_writer& w) const {
	w.w_fvector3(wm.bounds.p);
	w.w_float(wm.bounds.r);
	w.w_size_u32(wm.vertices.size());
	w.w_seq(wm.vertices);
}